

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeArmMOVTWInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  void *Decoder_00;
  uint64_t Address_00;
  uint64_t extraout_RDX;
  uint64_t Address_01;
  uint64_t Address_02;
  uint RegNo;
  
  RegNo = Insn >> 0xc & 0xf;
  uVar1 = MCInst_getOpcode(Inst);
  Address_01 = Address_00;
  if ((uVar1 != 0xd8) ||
     (DVar2 = DecodeGPRnopcRegisterClass(Inst,RegNo,Address_00,Decoder), Address_01 = extraout_RDX,
     (DVar2 | 2) == MCDisassembler_Success)) {
    DVar2 = DecodeGPRnopcRegisterClass(Inst,RegNo,Address_01,Decoder);
    Decoder_00 = (void *)(ulong)DVar2;
    if ((DVar2 == MCDisassembler_Success) || (DVar2 == MCDisassembler_SoftFail)) {
      MCOperand_CreateImm0(Inst,(ulong)(Insn >> 4 & 0xf000 | Insn & 0xfff));
      DVar2 = DecodePredicateOperand(Inst,Insn >> 0x1c,Address_02,Decoder_00);
      DVar2 = (*(code *)(&DAT_001c9e4c + *(int *)(&DAT_001c9e4c + (ulong)DVar2 * 4)))();
      return DVar2;
    }
  }
  return MCDisassembler_Fail;
}

Assistant:

static DecodeStatus DecodeArmMOVTWInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);
	unsigned imm = 0;

	imm |= (fieldFromInstruction_4(Insn, 0, 12) << 0);
	imm |= (fieldFromInstruction_4(Insn, 16, 4) << 12);

	if (MCInst_getOpcode(Inst) == ARM_MOVTi16)
		if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rd, Address, Decoder)))
			return MCDisassembler_Fail;

	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;

	MCOperand_CreateImm0(Inst, imm);

	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}